

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# seg_common.h
# Opt level: O2

void segfeatures_copy(segmentation *dst,segmentation *src)

{
  int16_t (*paiVar1) [8];
  int16_t (*paiVar2) [8];
  long lVar3;
  long lVar4;
  
  paiVar1 = src->feature_data;
  paiVar2 = dst->feature_data;
  for (lVar3 = 0; lVar3 != 8; lVar3 = lVar3 + 1) {
    dst->feature_mask[lVar3] = src->feature_mask[lVar3];
    for (lVar4 = 0; lVar4 != 8; lVar4 = lVar4 + 1) {
      (*paiVar2)[lVar4] = (*paiVar1)[lVar4];
    }
    paiVar1 = paiVar1 + 1;
    paiVar2 = paiVar2 + 1;
  }
  dst->segid_preskip = src->segid_preskip;
  dst->last_active_segid = src->last_active_segid;
  return;
}

Assistant:

static inline void segfeatures_copy(struct segmentation *dst,
                                    const struct segmentation *src) {
  int i, j;
  for (i = 0; i < MAX_SEGMENTS; i++) {
    dst->feature_mask[i] = src->feature_mask[i];
    for (j = 0; j < SEG_LVL_MAX; j++) {
      dst->feature_data[i][j] = src->feature_data[i][j];
    }
  }
  dst->segid_preskip = src->segid_preskip;
  dst->last_active_segid = src->last_active_segid;
}